

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_lightning.cpp
# Opt level: O0

void __thiscall DLightningThinker::Serialize(DLightningThinker *this,FArchive *arc)

{
  undefined1 auVar1 [16];
  bool bVar2;
  FArchive *pFVar3;
  ulong uVar4;
  short *psVar5;
  SWORD *local_28;
  short *lights;
  int i;
  FArchive *arc_local;
  DLightningThinker *this_local;
  
  DObject::Serialize((DObject *)this,arc);
  pFVar3 = FArchive::operator<<(arc,&this->Stopped);
  pFVar3 = FArchive::operator<<(pFVar3,&this->NextLightningFlash);
  FArchive::operator<<(pFVar3,&this->LightningFlashCount);
  bVar2 = FArchive::IsLoading(arc);
  if (bVar2) {
    if ((this->LightningLightLevels != (short *)0x0) && (this->LightningLightLevels != (short *)0x0)
       ) {
      operator_delete__(this->LightningLightLevels);
    }
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)numsectors;
    uVar4 = SUB168(auVar1 * ZEXT816(2),0);
    if (SUB168(auVar1 * ZEXT816(2),8) != 0) {
      uVar4 = 0xffffffffffffffff;
    }
    psVar5 = (short *)operator_new__(uVar4);
    this->LightningLightLevels = psVar5;
  }
  local_28 = this->LightningLightLevels;
  for (lights._4_4_ = numsectors; 0 < lights._4_4_; lights._4_4_ = lights._4_4_ + -1) {
    FArchive::operator<<(arc,local_28);
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void DLightningThinker::Serialize (FArchive &arc)
{
	int i;
	short *lights;

	Super::Serialize (arc);

	arc << Stopped << NextLightningFlash << LightningFlashCount;

	if (arc.IsLoading ())
	{
		if (LightningLightLevels != NULL)
		{
			delete[] LightningLightLevels;
		}
		LightningLightLevels = new short[numsectors];
	}
	lights = LightningLightLevels;
	for (i = numsectors; i > 0; ++lights, --i)
	{
		arc << *lights;
	}
}